

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O0

void __thiscall CVmObjFile::write_data_mode(CVmObjFile *this,vm_val_t *val)

{
  int iVar1;
  vmobjfile_ext_t *pvVar2;
  char *pcVar3;
  size_t sVar4;
  CVmObject *pCVar5;
  undefined4 extraout_var;
  CVmRun *this_00;
  int *in_RSI;
  CVmObjFile *in_RDI;
  CVmObjByteArray *bytarr;
  CVmObjBigNum *bignum;
  char *constp;
  vm_val_t new_str;
  CVmDataSource *fp;
  char buf [32];
  vm_val_t *in_stack_ffffffffffffff78;
  CVmDataSource *pCVar6;
  char *in_stack_ffffffffffffff80;
  undefined1 *in_stack_ffffffffffffff88;
  CVmDataSource *in_stack_ffffffffffffffa0;
  CVmObjBigNum *in_stack_ffffffffffffffa8;
  undefined1 local_50 [16];
  CVmDataSource *local_40;
  undefined1 local_38;
  undefined1 auStack_37 [39];
  int *local_10;
  
  local_10 = in_RSI;
  pvVar2 = get_ext(in_RDI);
  local_40 = pvVar2->fp;
  this_00 = (CVmRun *)(ulong)(*local_10 - 2);
  switch(this_00) {
  case (CVmRun *)0x0:
    local_38 = 8;
    iVar1 = (*local_40->_vptr_CVmDataSource[4])(local_40,&local_38,1);
    break;
  default:
    err_throw(0);
  case (CVmRun *)0x3:
    iVar1 = CVmObjBigNum::is_bignum_obj(0);
    if (iVar1 == 0) {
      iVar1 = CVmObjByteArray::is_byte_array(0);
      if (iVar1 == 0) {
        pCVar5 = vm_objp(0);
        iVar1 = (*pCVar5->_vptr_CVmObject[0x2c])(pCVar5,(ulong)(uint)local_10[2],local_50);
        pcVar3 = (char *)CONCAT44(extraout_var,iVar1);
        goto LAB_002e5459;
      }
      vm_objp(0);
      local_38 = 0x22;
      iVar1 = (*local_40->_vptr_CVmDataSource[4])(local_40,&local_38,1);
      if (iVar1 == 0) {
        iVar1 = CVmObjByteArray::write_to_data_file
                          ((CVmObjByteArray *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
        break;
      }
    }
    else {
      pCVar5 = vm_objp(0);
      local_38 = 0x21;
      iVar1 = (*local_40->_vptr_CVmDataSource[4])(local_40,&local_38,1);
      if (iVar1 == 0) {
        iVar1 = CVmObjBigNum::write_to_data_file(in_stack_ffffffffffffffa8,(CVmDataSource *)pCVar5);
        break;
      }
    }
    goto LAB_002e5628;
  case (CVmRun *)0x5:
    local_38 = 1;
    oswp4s(auStack_37,(long)local_10[2]);
    iVar1 = (*local_40->_vptr_CVmDataSource[4])(local_40,&local_38,5);
    break;
  case (CVmRun *)0x6:
    pcVar3 = vm_val_t::get_as_string(in_stack_ffffffffffffff78);
LAB_002e5459:
    local_38 = 3;
    iVar1 = (*local_40->_vptr_CVmDataSource[4])(local_40,&local_38,1);
    if (iVar1 == 0) {
      in_stack_ffffffffffffff88 = &local_38;
      sVar4 = vmb_get_len((char *)0x2e5491);
      ::oswp2(in_stack_ffffffffffffff88,(int)sVar4 + 2);
      iVar1 = (*local_40->_vptr_CVmDataSource[4])(local_40,&local_38,2);
      if (iVar1 == 0) {
        in_stack_ffffffffffffff80 = pcVar3 + 2;
        pCVar6 = local_40;
        sVar4 = vmb_get_len((char *)0x2e54e1);
        iVar1 = (*pCVar6->_vptr_CVmDataSource[4])(pCVar6,in_stack_ffffffffffffff80,sVar4);
        break;
      }
    }
    goto LAB_002e5628;
  case (CVmRun *)0xd:
    local_38 = 0x20;
    ::oswp4(auStack_37,(ulong)(uint)local_10[2]);
    iVar1 = (*local_40->_vptr_CVmDataSource[4])(local_40,&local_38,5);
  }
  if (iVar1 != 0) {
LAB_002e5628:
    CVmRun::throw_new_class
              (this_00,(vm_obj_id_t)((ulong)in_stack_ffffffffffffff88 >> 0x20),
               (uint)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  }
  return;
}

Assistant:

void CVmObjFile::write_data_mode(VMG_ const vm_val_t *val)
{
    char buf[32];
    CVmDataSource *fp = get_ext()->fp;
    vm_val_t new_str;
    const char *constp;

    /* see what type of data we want to put */
    switch(val->typ)
    {
    case VM_INT:
        /* put the type in the buffer */
        buf[0] = VMOBJFILE_TAG_INT;
        
        /* add the value in INT4 format */
        oswp4s(buf + 1, val->val.intval);
        
        /* write out the type prefix plus the value */
        if (fp->write(buf, 5))
            goto io_error;

        /* done */
        break;

    case VM_ENUM:
        /* put the type in the buffer */
        buf[0] = VMOBJFILE_TAG_ENUM;

        /* add the value in INT4 format */
        oswp4(buf + 1, val->val.enumval);

        /* write out the type prefix plus the value */
        if (fp->write(buf, 5))
            goto io_error;

        /* done */
        break;

    case VM_SSTRING:
        /* get the string value pointer */
        constp = val->get_as_string(vmg0_);

    write_binary_string:
        /* write the type prefix byte */
        buf[0] = VMOBJFILE_TAG_STRING;
        if (fp->write(buf, 1))
            goto io_error;

        /* 
         *   write the length prefix - for TADS 2 compatibility, include
         *   the bytes of the prefix itself in the length count 
         */
        oswp2(buf, vmb_get_len(constp) + 2);
        if (fp->write(buf, 2))
            goto io_error;

        /* write the string's bytes */
        if (fp->write(constp + VMB_LEN, vmb_get_len(constp)))
            goto io_error;

        /* done */
        break;

    case VM_OBJ:
        /*
         *   Write BigNumber and ByteArray types in special formats.  For
         *   other types, try converting to a string. 
         */
        if (CVmObjBigNum::is_bignum_obj(vmg_ val->val.obj))
        {
            CVmObjBigNum *bignum;
            
            /* we know it's a BigNumber - cast it properly */
            bignum = (CVmObjBigNum *)vm_objp(vmg_ val->val.obj);

            /* write the type tag */
            buf[0] = VMOBJFILE_TAG_BIGNUM;
            if (fp->write(buf, 1))
                goto io_error;

            /* write it out */
            if (bignum->write_to_data_file(fp))
                goto io_error;
        }
        else if (CVmObjByteArray::is_byte_array(vmg_ val->val.obj))
        {
            CVmObjByteArray *bytarr;

            /* we know it's a ByteArray - cast it properly */
            bytarr = (CVmObjByteArray *)vm_objp(vmg_ val->val.obj);

            /* write the type tag */
            buf[0] = VMOBJFILE_TAG_BYTEARRAY;
            if (fp->write(buf, 1))
                goto io_error;
            
            /* write the array */
            if (bytarr->write_to_data_file(fp))
                goto io_error;
        }
        else
        {
            /* 
             *   Cast it to a string value and write that out.  Note that
             *   we can ignore garbage collection for any new string we've
             *   created, since we're just calling the OS-level file
             *   writer, which will never invoke garbage collection.  
             */
            constp = vm_objp(vmg_ val->val.obj)
                     ->cast_to_string(vmg_ val->val.obj, &new_str);
            goto write_binary_string;
        }